

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_AddRepeatedMessage_Test::TestBody
          (GeneratedMessageReflectionTest_AddRepeatedMessage_Test *this)

{
  Reflection *this_00;
  bool bVar1;
  Descriptor *this_01;
  FieldDescriptor *field;
  Message *message_00;
  TestAllTypes_NestedMessage *this_02;
  char *message_01;
  AssertHelper local_3e0;
  Message local_3d8;
  int32_t local_3d0;
  int local_3cc;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar;
  string local_3b0;
  Message *local_390;
  Message *nested;
  FieldDescriptor *local_378;
  FieldDescriptor *nested_bb;
  Reflection *nested_reflection;
  Reflection *local_358;
  Reflection *reflection;
  TestAllTypes message;
  GeneratedMessageReflectionTest_AddRepeatedMessage_Test *this_local;
  
  message.field_0._808_8_ = this;
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)&reflection);
  local_358 = proto2_unittest::TestAllTypes::GetReflection();
  proto2_unittest::TestAllTypes_NestedMessage::default_instance();
  nested_bb = (FieldDescriptor *)proto2_unittest::TestAllTypes_NestedMessage::GetReflection();
  this_01 = proto2_unittest::TestAllTypes_NestedMessage::descriptor();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&nested,"bb");
  local_378 = Descriptor::FindFieldByName(this_01,_nested);
  this_00 = local_358;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b0,"repeated_nested_message",
             (allocator<char> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  field = F(&local_3b0);
  message_00 = Reflection::AddMessage(this_00,(Message *)&reflection,field,(MessageFactory *)0x0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_390 = message_00;
  Reflection::SetInt32((Reflection *)nested_bb,message_00,local_378,0xb);
  local_3cc = 0xb;
  this_02 = proto2_unittest::TestAllTypes::repeated_nested_message((TestAllTypes *)&reflection,0);
  local_3d0 = proto2_unittest::TestAllTypes_NestedMessage::bb(this_02);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_3c8,"11","message.repeated_nested_message(0).bb()",&local_3cc,
             &local_3d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar1) {
    testing::Message::Message(&local_3d8);
    message_01 = testing::AssertionResult::failure_message((AssertionResult *)local_3c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_3e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x419,message_01);
    testing::internal::AssertHelper::operator=(&local_3e0,&local_3d8);
    testing::internal::AssertHelper::~AssertHelper(&local_3e0);
    testing::Message::~Message(&local_3d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)&reflection);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, AddRepeatedMessage) {
  unittest::TestAllTypes message;

  const Reflection* reflection = message.GetReflection();
  const Reflection* nested_reflection =
      unittest::TestAllTypes::NestedMessage::default_instance().GetReflection();

  const FieldDescriptor* nested_bb =
      unittest::TestAllTypes::NestedMessage::descriptor()->FindFieldByName(
          "bb");

  Message* nested =
      reflection->AddMessage(&message, F("repeated_nested_message"));
  nested_reflection->SetInt32(nested, nested_bb, 11);

  EXPECT_EQ(11, message.repeated_nested_message(0).bb());
}